

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O2

int __thiscall
hanabi_learning_env::HanabiGame::GetMoveUid
          (HanabiGame *this,Type move_type,int card_index,int target_offset,int color,int rank)

{
  switch(move_type) {
  case kPlay:
    return card_index + this->hand_size_;
  case kDiscard:
    break;
  case kRevealColor:
    return color + this->hand_size_ * 2 + (target_offset + -1) * this->num_colors_;
  case kRevealRank:
    return rank + this->hand_size_ * 2 + (target_offset + -1) * this->num_ranks_ +
           (this->num_players_ + -1) * this->num_colors_;
  default:
    card_index = -1;
  }
  return card_index;
}

Assistant:

int HanabiGame::GetMoveUid(HanabiMove::Type move_type, int card_index,
                           int target_offset, int color, int rank) const {
  switch (move_type) {
    case HanabiMove::kDiscard:
      return card_index;
    case HanabiMove::kPlay:
      return MaxDiscardMoves() + card_index;
    case HanabiMove::kRevealColor:
      return MaxDiscardMoves() + MaxPlayMoves() +
             (target_offset - 1) * NumColors() + color;
    case HanabiMove::kRevealRank:
      return MaxDiscardMoves() + MaxPlayMoves() + MaxRevealColorMoves() +
             (target_offset - 1) * NumRanks() + rank;
    default:
      return -1;
  }
}